

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

Buffer * __thiscall Liby::UdpSocket::getReadBuf(UdpSocket *this,Endpoint *ep)

{
  bool bVar1;
  undefined4 *puVar2;
  pointer ppVar3;
  element_type *this_00;
  Buffer *pBVar4;
  _Self local_28;
  _Self local_20;
  iterator it;
  Endpoint *ep_local;
  UdpSocket *this_local;
  
  it._M_node = (_Base_ptr)ep;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
       ::find(&this->conns_,ep);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
       ::end(&this->conns_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>
             ::operator->(&local_20);
    this_00 = std::
              __shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ppVar3->second);
    pBVar4 = UdpConnection::getReadBuf(this_00);
    return pBVar4;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

Buffer &UdpSocket::getReadBuf(const Liby::Endpoint &ep) {
    auto it = conns_.find(ep);
    if (it == conns_.end()) {
        throw 0;
    } else {
        return it->second->getReadBuf();
    }
}